

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile_sort_tree.hpp
# Opt level: O0

float __thiscall
duckdb::Interpolator<true>::Operation<float,float,duckdb::QuantileDirect<float>>
          (Interpolator<true> *this,float *v_t,Vector *result,QuantileDirect<float> *accessor)

{
  float *in_RCX;
  RESULT_TYPE_conflict3 RVar1;
  float fVar2;
  float *in_stack_00000028;
  Interpolator<true> *in_stack_00000030;
  undefined4 in_stack_ffffffffffffffd8;
  
  RVar1 = InterpolateInternal<float,duckdb::QuantileDirect<float>>
                    (in_stack_00000030,in_stack_00000028,(QuantileDirect<float> *)this);
  fVar2 = CastInterpolation::Cast<float,float>
                    (in_RCX,(Vector *)CONCAT44(RVar1,in_stack_ffffffffffffffd8));
  return fVar2;
}

Assistant:

TARGET_TYPE Operation(INPUT_TYPE *v_t, Vector &result, const ACCESSOR &accessor = ACCESSOR()) const {
		using ACCESS_TYPE = typename ACCESSOR::RESULT_TYPE;
		return CastInterpolation::Cast<ACCESS_TYPE, TARGET_TYPE>(InterpolateInternal(v_t, accessor), result);
	}